

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::ContainerEqMatcher<std::vector<int,std::allocator<int>>>::
MatchAndExplain<std::vector<int,std::allocator<int>>>
          (ContainerEqMatcher<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *lhs,MatchResultListener *listener)

{
  ostream *this_00;
  bool bVar1;
  int iVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it_1;
  int *piVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it_2;
  int *piVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  char *pcVar8;
  const_iterator it;
  char *pcVar9;
  
  piVar4 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar3 = *(int **)this;
  piVar7 = *(int **)(this + 8);
  if (((long)piVar6 - (long)piVar4 != (long)piVar7 - (long)piVar3) ||
     ((bVar1 = true, piVar6 != piVar4 &&
      (iVar2 = bcmp(piVar4,piVar3,(long)piVar6 - (long)piVar4), iVar2 != 0)))) {
    this_00 = listener->stream_;
    if (this_00 != (ostream *)0x0) {
      if (piVar4 == piVar6) {
        pcVar9 = "which";
      }
      else {
        bVar1 = false;
        do {
          piVar3 = *(int **)this;
          piVar7 = *(int **)(this + 8);
          if (piVar3 != piVar7) {
            do {
              if (*piVar3 == *piVar4) {
                if (piVar3 != piVar7) goto LAB_001ba4cf;
                break;
              }
              piVar3 = piVar3 + 1;
            } while (piVar3 != piVar7);
          }
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (this_00,"which has these unexpected elements: ",0x25);
            bVar1 = true;
          }
          std::ostream::operator<<((ostream *)this_00,*piVar4);
          piVar6 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
LAB_001ba4cf:
          piVar4 = piVar4 + 1;
        } while (piVar4 != piVar6);
        piVar3 = *(int **)this;
        piVar7 = *(int **)(this + 8);
        pcVar9 = "which";
        if (bVar1) {
          pcVar9 = ",\nand";
        }
      }
      if (piVar3 != piVar7) {
        bVar1 = false;
        do {
          piVar4 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar4 != piVar6) {
            do {
              if (*piVar4 == *piVar3) {
                if (piVar4 != piVar6) goto LAB_001ba57a;
                break;
              }
              piVar4 = piVar4 + 1;
            } while (piVar4 != piVar6);
          }
          if (bVar1) {
            lVar5 = 2;
            pcVar8 = ", ";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar9,5);
            lVar5 = 0x27;
            pcVar8 = " doesn\'t have these expected elements: ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar8,lVar5);
          std::ostream::operator<<((ostream *)this_00,*piVar3);
          piVar7 = *(int **)(this + 8);
          bVar1 = true;
LAB_001ba57a:
          piVar3 = piVar3 + 1;
        } while (piVar3 != piVar7);
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }